

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::Decode
          (UnderwaterAcousticFundamentalParameterData *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x13 < KVar1) {
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16AEPI);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16ScanPattern);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BeamCenterAzimuth);
    KDataStream::Read<float>(stream,(float *)&this->m_f32AzimuthalBeamWidth);
    KDataStream::Read<float>(stream,(float *)&this->m_f32BeamCenterDE);
    KDataStream::Read<float>(stream,(float *)&this->m_f32DEBeamwidth);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void UnderwaterAcousticFundamentalParameterData::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < UNDERWATER_ACOUSTIC_FUNDAMENTAL_PARAMETER_SIZE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui16AEPI
           >> m_ui16ScanPattern
           >> m_f32BeamCenterAzimuth
           >> m_f32AzimuthalBeamWidth
           >> m_f32BeamCenterDE
           >> m_f32DEBeamwidth;
}